

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rds_test.cc
# Opt level: O0

int test_modify_db_instance_maintain_time(void)

{
  code *pcVar1;
  char *__s;
  RdsModifyDBInstanceMaintainTimeRequestType *pRVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1d1;
  int ret;
  HttpTestListener *local_1b0;
  HttpTestListener *listener;
  string local_1a0;
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [55];
  allocator<char> local_119;
  string local_118 [32];
  RdsModifyDBInstanceMaintainTimeRequestType *local_f8;
  Rds *rds;
  undefined1 local_e8 [7];
  RdsModifyDBInstanceMaintainTimeResponseType resp;
  RdsModifyDBInstanceMaintainTimeRequestType req;
  
  aliyun::RdsModifyDBInstanceMaintainTimeRequestType::RdsModifyDBInstanceMaintainTimeRequestType
            ((RdsModifyDBInstanceMaintainTimeRequestType *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"cn-hangzhou",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"my_appid",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"my_secret",&local_179);
  pRVar2 = (RdsModifyDBInstanceMaintainTimeRequestType *)
           aliyun::Rds::CreateRdsClient(local_118,local_150,local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  local_f8 = pRVar2;
  if (pRVar2 == (RdsModifyDBInstanceMaintainTimeRequestType *)0x0) {
    aliyun::RdsModifyDBInstanceMaintainTimeRequestType::~RdsModifyDBInstanceMaintainTimeRequestType
              ((RdsModifyDBInstanceMaintainTimeRequestType *)local_e8);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Rds::SetProxyHost((Rds *)pRVar2,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Rds::SetUseTls((Rds *)local_f8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_modify_db_instance_maintain_time_response;
  local_1b0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1d1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1d1);
  HttpTestListener::Start(local_1b0);
  std::__cxx11::string::operator=((string *)local_e8,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"ClientToken");
  std::__cxx11::string::operator=
            ((string *)(req.client_token.field_2._M_local_buf + 8),"DBInstanceId");
  std::__cxx11::string::operator=
            ((string *)(req.db_instance_id.field_2._M_local_buf + 8),"MaintainTime");
  std::__cxx11::string::operator=
            ((string *)(req.maintain_time.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Rds::ModifyDBInstanceMaintainTime
            (local_f8,(RdsModifyDBInstanceMaintainTimeResponseType *)local_e8,
             (RdsErrorInfo *)((long)&rds + 7));
  HttpTestListener::WaitComplete(local_1b0);
  pHVar3 = local_1b0;
  if (local_1b0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1b0);
    operator_delete(pHVar3,0x180);
  }
  pRVar2 = local_f8;
  if (local_f8 != (RdsModifyDBInstanceMaintainTimeRequestType *)0x0) {
    aliyun::Rds::~Rds((Rds *)local_f8);
    operator_delete(pRVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_modify_db_instance_maintain_time() {
  RdsModifyDBInstanceMaintainTimeRequestType req;
  RdsModifyDBInstanceMaintainTimeResponseType resp;
  Rds* rds = Rds::CreateRdsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!rds) return 0;
  rds->SetProxyHost("127.0.0.1:12234");
  rds->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_modify_db_instance_maintain_time_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.client_token = "ClientToken";
  req.db_instance_id = "DBInstanceId";
  req.maintain_time = "MaintainTime";
  req.owner_account = "OwnerAccount";
  int ret = rds->ModifyDBInstanceMaintainTime(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete rds;
}